

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int available_hreg_p(int hreg,MIR_reg_t type,int nregs,bitmap_t *conflict_locs,
                    live_range_t_conflict lr)

{
  void **ppvVar1;
  bb_t *ppbVar2;
  undefined1 auVar3 [32];
  byte bVar4;
  long *plVar5;
  bb_insn_t pbVar6;
  in_edge_t_conflict peVar7;
  in_edge_t peVar8;
  bitmap_t pVVar9;
  MIR_reg_t *pMVar10;
  HTAB_MIR_item_t *pHVar11;
  bb_t pbVar12;
  MIR_module_t pMVar13;
  VARR_MIR_reg_t *pVVar14;
  bb_t pbVar15;
  ra_ctx *prVar16;
  FILE *pFVar17;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  int iVar25;
  int iVar26;
  MIR_op_mode_t MVar27;
  MIR_type_t MVar28;
  MIR_reg_t MVar29;
  ulong extraout_RAX;
  in_edge_t peVar30;
  ulong uVar31;
  MIR_insn_t_conflict pMVar32;
  int64_t iVar33;
  MIR_insn_t_conflict insn;
  gen_ctx_t pgVar34;
  undefined1 (*pauVar35) [32];
  uint uVar36;
  gen_ctx *pgVar37;
  MIR_context_t pMVar38;
  ulong uVar39;
  MIR_disp_t disp;
  MIR_reg_t base_reg;
  undefined4 in_register_00000014;
  in_edge_t extraout_RDX;
  DLIST_in_edge_t *pDVar40;
  gen_ctx *pgVar41;
  long lVar42;
  uint uVar43;
  gen_ctx *pgVar44;
  undefined4 in_register_00000034;
  gen_ctx_t pgVar45;
  gen_ctx_t pgVar46;
  ulong uVar47;
  gen_ctx *pgVar48;
  gen_ctx *bb;
  gen_ctx *res;
  ulong uVar49;
  uint uVar50;
  gen_ctx *unaff_R12;
  gen_ctx *pgVar51;
  DLIST_LINK_bb_t *pDVar52;
  MIR_context_t unaff_R13;
  uint *puVar53;
  ulong uVar54;
  in_edge_t_conflict peVar55;
  MIR_context_t ctx;
  gen_ctx *unaff_R15;
  size_t sVar56;
  bool bVar57;
  lr_gap_t el;
  uint uStack_2fc;
  ulong uStack_2e0;
  int iStack_2d4;
  gen_ctx *pgStack_2d0;
  DLIST_LINK_bb_t *pDStack_2c8;
  uint uStack_2bc;
  MIR_context_t pMStack_2b8;
  ulong uStack_2b0;
  size_t sStack_2a8;
  MIR_op_t MStack_2a0;
  uint *puStack_268;
  MIR_op_t MStack_260;
  MIR_op_t MStack_230;
  bb_t pbStack_200;
  bb_t pbStack_1f8;
  in_edge_t_conflict peStack_1f0;
  in_edge_t_conflict peStack_1e8;
  out_edge_t peStack_1e0;
  out_edge_t peStack_1d8;
  bb_insn_t pbStack_1d0;
  bb_insn_t pbStack_1c8;
  bitmap_t pVStack_1c0;
  bitmap_t pVStack_1b8;
  bitmap_t pVStack_1b0;
  bitmap_t pVStack_1a8;
  int aiStack_1a0 [12];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  gen_ctx *pgStack_108;
  gen_ctx *pgStack_100;
  MIR_context_t pMStack_f8;
  in_edge_t_conflict peStack_f0;
  gen_ctx *pgStack_e8;
  gen_ctx *pgStack_e0;
  gen_ctx_t pgStack_d8;
  gen_ctx *pgStack_d0;
  gen_ctx_t pgStack_c8;
  in_edge_t peStack_c0;
  MIR_context_t pMStack_b8;
  uint uStack_b0;
  uint uStack_ac;
  gen_ctx *pgStack_a8;
  gen_ctx *pgStack_a0;
  ulong uStack_98;
  gen_ctx *pgStack_90;
  gen_ctx *pgStack_88;
  MIR_context_t pMStack_80;
  gen_ctx_t pgStack_78;
  gen_ctx *pgStack_70;
  gen_ctx *pgStack_68;
  ulong uStack_60;
  gen_ctx *pgStack_58;
  gen_ctx *pgStack_50;
  
  pgVar45 = (gen_ctx_t)CONCAT44(in_register_00000034,type);
  iVar26 = *(int *)(conflict_locs + 1);
  iVar25 = *(int *)((long)conflict_locs + 0xc);
  pgVar37 = (gen_ctx *)(long)iVar25;
  bVar57 = iVar25 < iVar26;
  if (iVar25 < iVar26) {
LAB_00170371:
    return (uint)bVar57;
  }
  pgVar48 = (gen_ctx *)(long)hreg;
  uVar50 = hreg + 1;
  pgVar41 = (gen_ctx *)(1L << ((ulong)uVar50 & 0x3f));
  uVar43 = (iVar25 - iVar26) + 1;
  res = (gen_ctx *)(long)iVar26;
  while( true ) {
    pgVar44 = (gen_ctx *)(ulong)uVar43;
    plVar5 = *(long **)(CONCAT44(in_register_00000014,nregs) + (long)res * 8);
    if (plVar5 == (long *)0x0) break;
    unaff_R15 = (gen_ctx *)(*plVar5 << 6);
    if (((pgVar48 < unaff_R15) &&
        (unaff_R12 = (gen_ctx *)plVar5[2],
        ((ulong)unaff_R12->call_used_hard_regs[((ulong)pgVar48 >> 6) - 0xd] &
        1L << ((ulong)pgVar48 & 0x3f)) != 0)) ||
       ((1 < (int)type &&
        ((0x21 < uVar50 ||
         (((gen_ctx *)(ulong)uVar50 < unaff_R15 && ((*(ulong *)plVar5[2] & (ulong)pgVar41) != 0)))))
        ))) goto LAB_00170371;
    bVar57 = (long)pgVar37 <= (long)res;
    uVar43 = uVar43 - 1;
    res = (gen_ctx *)((long)&res->ctx + 1);
    if (uVar43 == 0) goto LAB_00170371;
  }
  available_hreg_p_cold_1();
  pbVar6 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
  pgVar46 = pgVar45;
  bb = pgVar48;
  pgVar51 = unaff_R12;
  pgStack_78 = (gen_ctx_t)0x0;
  uStack_60 = extraout_RAX;
  pgStack_58 = pgVar41;
  pgStack_50 = unaff_R12;
  if ((pbVar6 == (bb_insn_t)0x0) || (*(long *)&pbVar6->mem_index == 0)) goto LAB_0017053a;
  pbVar6->insn = (MIR_insn_t)0x0;
  pgVar51 = (gen_ctx *)pgVar45->ctx;
  if (pgVar51 == (gen_ctx *)0x0) goto LAB_00170401;
  unaff_R13 = (MIR_context_t)&DAT_00000001;
  while( true ) {
    unaff_R15 = (gen_ctx *)((MIR_module *)&pgVar48->temp_bitmap)->data;
    pgVar44 = (gen_ctx *)((gen_ctx *)pgVar51->ctx)->ctx;
    pgVar46 = (gen_ctx_t)((long)&pgVar44->ctx + 1);
    pgStack_68 = (gen_ctx *)0x1703da;
    bb = unaff_R15;
    bitmap_expand((bitmap_t)unaff_R15,(size_t)pgVar46);
    if (unaff_R15 == (gen_ctx *)0x0) break;
    pgVar37 = (gen_ctx *)((ulong)pgVar44 >> 6);
    ppvVar1 = &unaff_R15->curr_func_item->data + (long)pgVar37;
    *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)pgVar44 & 0x3f));
    pgVar51 = *(gen_ctx **)&pgVar51->optimize_level;
    if (pgVar51 == (gen_ctx *)0x0) {
LAB_00170401:
      unaff_R13 = pgVar45->ctx;
      if (unaff_R13 == (MIR_context_t)0x0) {
        uStack_60 = 0;
      }
      else {
        uStack_60 = 0;
        do {
          pgVar51 = unaff_R13->gen_ctx;
          pgStack_68 = (gen_ctx *)0x170421;
          bb = pgVar51;
          uVar43 = bb_loop_level((bb_t_conflict)pgVar51);
          unaff_R15 = (gen_ctx *)(ulong)uVar43;
          pgVar44 = (gen_ctx *)0xffffffff;
          for (pgVar45 = (gen_ctx_t)((DLIST_out_edge_t *)&pgVar51->addr_regs)->head;
              iVar26 = (int)pgVar44, pgVar45 != (gen_ctx_t)0x0;
              pgVar45 = (gen_ctx_t)pgVar45->to_free) {
            pbVar6 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
            if (pbVar6 == (bb_insn_t)0x0) {
              pgStack_68 = (gen_ctx *)0x170530;
              gap_lr_spill_cost_cold_2();
              goto LAB_00170530;
            }
            bb = (gen_ctx *)((DLIST_LINK_MIR_insn_t *)&pgVar45->optimize_level)->prev;
            pgVar37 = (gen_ctx *)bb->ctx;
            if (((gen_ctx *)((long)pbVar6->insn << 6) <= pgVar37) ||
               ((*(ulong *)(*(long *)&pbVar6->mem_index + ((ulong)pgVar37 >> 6) * 8) >>
                 ((ulong)pgVar37 & 0x3f) & 1) == 0)) {
              pgStack_68 = (gen_ctx *)0x17046d;
              iVar25 = bb_loop_level((bb_t_conflict)bb);
              pgVar37 = (gen_ctx *)(ulong)(iVar25 + 1U);
              if (iVar26 <= iVar25) {
                pgVar44 = (gen_ctx *)(ulong)(iVar25 + 1U);
              }
            }
          }
          uVar43 = uVar43 + 1;
          unaff_R15 = (gen_ctx *)(ulong)uVar43;
          if (-1 < iVar26) {
            if ((int)uVar43 <= iVar26) {
              pgVar44 = unaff_R15;
            }
            uStack_60 = (ulong)(uint)((int)uStack_60 + (int)pgVar44 * 2);
          }
          pgVar44 = (gen_ctx *)0xffffffff;
          for (pgVar45 = (gen_ctx_t)((DLIST_in_edge_t *)&pgVar51->addr_insn_p)->head;
              uVar50 = (uint)pgVar44, pgVar45 != (gen_ctx_t)0x0;
              pgVar45 = (gen_ctx_t)pgVar45->debug_file) {
            pbVar6 = (bb_insn_t)((MIR_module *)&pgVar48->temp_bitmap)->data;
            if (pbVar6 == (bb_insn_t)0x0) goto LAB_00170530;
            bb = (gen_ctx *)pgVar45->ctx;
            pgVar37 = (gen_ctx *)bb->ctx;
            if (((gen_ctx *)((long)pbVar6->insn << 6) <= pgVar37) ||
               ((*(ulong *)(*(long *)&pbVar6->mem_index + ((ulong)pgVar37 >> 6) * 8) >>
                 ((ulong)pgVar37 & 0x3f) & 1) == 0)) {
              pgStack_68 = (gen_ctx *)0x1704dc;
              iVar26 = bb_loop_level((bb_t_conflict)bb);
              pgVar37 = (gen_ctx *)(ulong)(iVar26 + 1U);
              if ((int)uVar50 <= iVar26) {
                pgVar44 = (gen_ctx *)(ulong)(iVar26 + 1U);
              }
            }
          }
          if (-1 < (int)uVar50) {
            if ((int)uVar50 < (int)uVar43) {
              uVar43 = uVar50;
            }
            uStack_60 = (ulong)((int)uStack_60 + uVar43 * 2);
          }
          unaff_R13 = (MIR_context_t)unaff_R13->c2mir_ctx;
        } while (unaff_R13 != (MIR_context_t)0x0);
      }
      return (int)uStack_60;
    }
  }
LAB_00170535:
  pgStack_68 = (gen_ctx *)0x17053a;
  gap_lr_spill_cost_cold_1();
  pgVar41 = pgVar48;
  pgStack_78 = pgVar45;
LAB_0017053a:
  pgStack_68 = (gen_ctx *)HTAB_lr_gap_t_do;
  gap_lr_spill_cost_cold_4();
  peVar55 = (in_edge_t_conflict)bb->tied_regs;
  pgStack_c8 = pgVar46;
  pgStack_90 = pgVar41;
  pgStack_88 = pgVar51;
  pMStack_80 = unaff_R13;
  pgStack_70 = unaff_R15;
  pgStack_68 = pgVar44;
  if (peVar55 == (in_edge_t_conflict)0x0) {
    pgStack_e0 = (gen_ctx *)0x1708ad;
    HTAB_lr_gap_t_do_cold_8();
    pgVar48 = pgVar37;
    pgVar45 = bb;
    res = unaff_R15;
LAB_001708ad:
    pgStack_e0 = (gen_ctx *)0x1708b2;
    HTAB_lr_gap_t_do_cold_7();
LAB_001708b2:
    pgStack_e0 = (gen_ctx *)0x1708b7;
    HTAB_lr_gap_t_do_cold_2();
    pMVar38 = unaff_R13;
LAB_001708b7:
    pgStack_e0 = (gen_ctx *)0x1708bc;
    HTAB_lr_gap_t_do_cold_1();
    pgVar37 = pgVar41;
LAB_001708bc:
    pgStack_e0 = (gen_ctx *)0x1708c1;
    HTAB_lr_gap_t_do_cold_4();
LAB_001708c1:
    pgStack_e0 = (gen_ctx *)0x1708c6;
    HTAB_lr_gap_t_do_cold_6();
  }
  else {
    peVar7 = ((DLIST_in_edge_t *)&bb->addr_insn_p)->head;
    pgVar48 = pgVar37;
    pgVar45 = bb;
    if (peVar7 == (in_edge_t_conflict)0x0) goto LAB_001708ad;
    pgVar51 = (gen_ctx *)((ulong)pgVar37 & 0xffffffff);
    pgVar41 = (gen_ctx *)peVar55->src;
    pgVar48 = (gen_ctx *)bb->curr_func_item;
    uVar43 = (int)pgVar37 - 1;
    pgVar44 = (gen_ctx *)(ulong)uVar43;
    pgStack_d8 = bb;
    pgStack_d0 = pgVar48;
    peStack_c0 = extraout_RDX;
    if (1 < uVar43) {
LAB_001706df:
      pgStack_e0 = (gen_ctx *)0x1706f5;
      iVar26 = (*(code *)pgStack_d8->debug_file)(pgStack_c8,peStack_c0,pgStack_d0);
      uVar50 = iVar26 + (uint)(iVar26 == 0);
      pgVar45 = (gen_ctx_t)(ulong)uVar50;
      pgVar46 = pgStack_d8;
      if ((in_edge_t_conflict)pgStack_d8->tied_regs == (in_edge_t_conflict)0x0) goto LAB_001708b2;
      pgVar48 = (gen_ctx *)((DLIST_in_edge_t *)&pgStack_d8->addr_insn_p)->head;
      pMVar38 = unaff_R13;
      uStack_b0 = uVar43;
      pgStack_a8 = res;
      pgStack_a0 = pgVar51;
      if (pgVar48 != (gen_ctx *)0x0) {
        uVar54 = (ulong)((int)pgVar41 - 1);
        peVar30 = (((in_edge_t_conflict)pgStack_d8->tied_regs)->in_link).prev;
        peVar8 = ((DLIST_LINK_in_edge_t *)&pgVar48->curr_func_item)->prev;
        pMStack_b8 = (MIR_context_t)(uint *)0x0;
        uVar43 = uVar50;
        uStack_ac = uVar50;
        uStack_98 = uVar54;
        do {
          uVar43 = uVar43 & (uint)uVar54;
          puVar53 = (uint *)((long)&peVar30->src + (ulong)uVar43 * 4);
          uVar31 = (ulong)*puVar53;
          pMVar38 = (MIR_context_t)puVar53;
          if (uVar31 != 0xfffffffe) {
            if (*puVar53 == 0xffffffff) {
              if (1 < uStack_b0) {
                return 0;
              }
              *(int *)&pgVar46->ctx = *(int *)&pgVar46->ctx + 1;
              if (pMStack_b8 != (MIR_context_t)0x0) {
                puVar53 = (uint *)pMStack_b8;
              }
              uVar54 = (ulong)(uint)*(size_t *)&pgVar46->optimize_level;
              *(int *)(&peVar8->src + uVar54 * 3) = (int)pgVar45;
              (&peVar8->dst)[uVar54 * 3] = (bb_t)pgStack_c8;
              *(in_edge_t *)((long)&peVar8->in_link + uVar54 * 0x18) = peStack_c0;
              uVar43 = (uint)*(size_t *)&pgVar46->optimize_level;
              pgVar46->optimize_level = uVar43 + 1;
              *puVar53 = uVar43;
              pgStack_a8->ctx = (MIR_context_t)pgStack_c8;
              *(in_edge_t *)&pgStack_a8->optimize_level = peStack_c0;
              return 0;
            }
            pMVar38 = pMStack_b8;
            if (*(int *)(&peVar8->src + uVar31 * 3) == (int)pgVar45) {
              ppbVar2 = &peVar8->src + uVar31 * 3;
              pgStack_e0 = (gen_ctx *)0x170790;
              iVar26 = (*(code *)((DLIST_LINK_bb_t *)&pgStack_d8->debug_level)->prev)
                                 (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,
                                  pgStack_c8,peStack_c0,pgStack_d0);
              pgVar45 = (gen_ctx_t)(ulong)uStack_ac;
              pMVar38 = pMStack_b8;
              uVar54 = uStack_98;
              pgVar46 = pgStack_d8;
              if (iVar26 != 0) {
                if ((int)pgStack_a0 == 3) {
                  *(int *)&pgStack_d8->ctx = *(int *)&pgStack_d8->ctx + -1;
                  *puVar53 = 0xfffffffe;
                  if ((bb_t)pgStack_d8->to_free != (bb_t)0x0) {
                    pgStack_e0 = (gen_ctx *)0x17087b;
                    (*(code *)pgStack_d8->to_free)
                              (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pgStack_d0);
                  }
                  *(undefined4 *)ppbVar2 = 0;
                }
                else {
                  if ((int)pgStack_a0 == 2) {
                    if ((bb_t)pgStack_d8->to_free != (bb_t)0x0) {
                      pgStack_e0 = (gen_ctx *)0x17083e;
                      (*(code *)pgStack_d8->to_free)
                                (ppbVar2[1],((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev,pgStack_d0
                                );
                    }
                    ppbVar2[1] = (bb_t)pgStack_c8;
                    ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev = peStack_c0;
                  }
                  peVar30 = ((DLIST_LINK_in_edge_t *)(ppbVar2 + 2))->prev;
                  pgStack_a8->ctx = (MIR_context_t)ppbVar2[1];
                  *(in_edge_t *)&pgStack_a8->optimize_level = peVar30;
                }
                return 1;
              }
            }
          }
          uVar50 = uVar50 >> 0xb;
          uVar43 = uVar50 + 1 + uVar43 * 5;
          *(int *)&pgVar46->field_0xc = *(int *)&pgVar46->field_0xc + 1;
          pMStack_b8 = pMVar38;
        } while( true );
      }
      goto LAB_001708b7;
    }
    pgVar37 = (gen_ctx *)peVar7->src;
    if ((int)*(size_t *)&bb->optimize_level != (int)pgVar37) goto LAB_001706df;
    pgVar45 = (gen_ctx_t)(peVar55->in_link).prev;
    pMVar38 = unaff_R13;
    if (pgVar45 == (gen_ctx_t)0x0) goto LAB_001708c1;
    pMVar38 = (MIR_context_t)(ulong)((uint)pgVar41 * 2);
    if ((MIR_context_t)peVar55->dst != pMVar38) {
      pgVar46 = (gen_ctx_t)((long)pMVar38 * 4);
      pgStack_e0 = (gen_ctx *)0x1705d1;
      pMStack_b8 = pMVar38;
      peVar30 = (in_edge_t)realloc(pgVar45,(size_t)pgVar46);
      (peVar55->in_link).prev = peVar30;
      pMVar38 = pMStack_b8;
    }
    peVar55->dst = (bb_t)pMVar38;
    peVar55->src = (bb_t)pMVar38;
    if ((in_edge_t_conflict)pgStack_d8->tied_regs != (in_edge_t_conflict)0x0) {
      if ((int)pMVar38 != 0) {
        pgVar45 = (gen_ctx_t)(((in_edge_t_conflict)pgStack_d8->tied_regs)->in_link).prev;
        pgVar46 = (gen_ctx_t)0xff;
        pgStack_e0 = (gen_ctx *)0x170612;
        memset(pgVar45,0xff,(ulong)((uint)pgVar41 & 0x7fffffff) << 3);
      }
      peVar55 = ((DLIST_in_edge_t *)&pgStack_d8->addr_insn_p)->head;
      if ((peVar55 != (in_edge_t_conflict)0x0) &&
         (pgVar45 = (gen_ctx_t)(peVar55->in_link).prev, pgVar45 != (gen_ctx_t)0x0)) {
        pgVar37 = (gen_ctx *)(ulong)(uint)((int)pgVar37 * 2);
        if ((gen_ctx *)peVar55->dst != pgVar37) {
          pgVar46 = (gen_ctx_t)((long)pgVar37 * 0x18);
          pgStack_e0 = (gen_ctx *)0x17064d;
          peVar30 = (in_edge_t)realloc(pgVar45,(size_t)pgVar46);
          (peVar55->in_link).prev = peVar30;
        }
        peVar55->dst = (bb_t)pgVar37;
        peVar55->src = (bb_t)pgVar37;
        peVar7 = ((DLIST_in_edge_t *)&pgStack_d8->addr_insn_p)->head;
        if (peVar7 == (in_edge_t_conflict)0x0) goto LAB_001708cb;
        pgVar48 = (gen_ctx *)(peVar7->in_link).prev;
        uVar50 = *(uint *)((long)&pgStack_d8->ctx + 4);
        uVar36 = (uint)*(size_t *)&pgStack_d8->optimize_level;
        *(undefined4 *)&pgStack_d8->ctx = 0;
        pgStack_d8->optimize_level = 0;
        *(undefined4 *)((long)&pgStack_d8->ctx + 4) = 0;
        if (uVar50 < uVar36) {
          peVar55 = (in_edge_t_conflict)((long)&pgVar48->curr_func_item + (ulong)uVar50 * 0x18);
          lVar42 = (ulong)uVar36 - (ulong)uVar50;
          pgVar45 = pgStack_d8;
          do {
            if (*(int *)((long)peVar55 + -0x10) != 0) {
              pgStack_e0 = (gen_ctx *)0x1706b0;
              el.lr = *(live_range_t_conflict *)peVar55;
              el._0_8_ = *(undefined8 *)((long)peVar55 + -8);
              HTAB_lr_gap_t_do((HTAB_lr_gap_t *)pgVar45,el,HTAB_INSERT,(lr_gap_t *)res);
              pgVar48 = *(gen_ctx **)peVar55;
              pgStack_e0 = (gen_ctx *)0x1706ca;
              (*(code *)((DLIST_LINK_bb_t *)&pgStack_d8->debug_level)->prev)
                        ((gen_ctx *)res->ctx,*(c2mir_ctx **)&res->optimize_level,
                         *(undefined8 *)((long)peVar55 + -8),pgVar48,pgStack_d0);
              pgVar45 = pgStack_d8;
            }
            peVar55 = (in_edge_t_conflict)((long)peVar55 + 0x18);
            lVar42 = lVar42 + -1;
          } while (lVar42 != 0);
        }
        pgVar41 = (gen_ctx *)((ulong)pMVar38 & 0xffffffff);
        unaff_R13 = pMVar38;
        goto LAB_001706df;
      }
      goto LAB_001708bc;
    }
  }
  pgStack_e0 = (gen_ctx *)0x1708cb;
  HTAB_lr_gap_t_do_cold_5();
LAB_001708cb:
  pgStack_e0 = (gen_ctx *)rewrite_insn;
  HTAB_lr_gap_t_do_cold_3();
  ctx = pgVar45->ctx;
  uStack_2b0 = 0;
  pgStack_108 = pgVar37;
  pgStack_100 = pgVar51;
  pMStack_f8 = pMVar38;
  peStack_f0 = peVar55;
  pgStack_e8 = res;
  pgStack_e0 = pgVar44;
  MIR_new_int_op(ctx,0);
  MIR_new_int_op(ctx,0);
  sStack_2a8 = MIR_insn_nops(ctx,(MIR_insn_t_conflict)pgVar46);
  pDStack_2c8 = (DLIST_LINK_bb_t *)&pgVar46->debug_level;
  puStack_268 = (uint *)((long)&((DLIST_out_edge_t *)&pgVar46->addr_regs)->head + 4);
  uStack_2fc = 0xffffffff;
  uStack_2bc = 0xffffffff;
  iVar26 = 0;
  pgStack_2d0 = pgVar48;
  pMStack_2b8 = ctx;
LAB_00170986:
  if (sStack_2a8 != 0) {
    sVar56 = 0;
    puVar53 = puStack_268;
    do {
      MVar27 = MIR_insn_op_mode(ctx,(MIR_insn_t_conflict)pgVar46,sVar56,&iStack_2d4);
      pgVar37 = pgStack_2d0;
      if (((iVar26 != 0) || ((iStack_2d4 != 0 && ((char)puVar53[-7] != '\v')))) &&
         ((iStack_2d4 == 0 || iVar26 != 1 || ((char)puVar53[-7] == '\v')))) {
        if ((char)puVar53[-7] == '\v') {
          uVar54 = (ulong)puVar53[-1];
          if (uVar54 < 0x22) {
            pVVar9 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar9,uVar54 + 1);
            if (pVVar9 == (bitmap_t)0x0) goto LAB_001720bd;
            *pVVar9->varr = *pVVar9->varr | 1L << (uVar54 & 0x3f);
          }
          uVar54 = (ulong)*puVar53;
          if (uVar54 < 0x22) {
            pVVar9 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar9,uVar54 + 1);
            if (pVVar9 == (bitmap_t)0x0) goto LAB_001720c2;
            *pVVar9->varr = *pVVar9->varr | 1L << (uVar54 & 0x3f);
          }
          uVar43 = puVar53[-1];
          uVar54 = (ulong)uVar43;
          if (uVar54 != 0xffffffff) {
            uVar50 = *puVar53;
            if (uVar50 - 0x22 < 0xffffffdd && 0x21 < uVar43) {
              pVVar14 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar14 == (VARR_MIR_reg_t *)0x0) ||
                  (pMVar10 = pVVar14->varr, pMVar10 == (MIR_reg_t *)0x0)) ||
                 (pVVar14->els_num <= uVar54)) goto LAB_001720ae;
              if (0x21 < pMVar10[uVar54]) {
                if (pVVar14->els_num <= (ulong)uVar50) goto LAB_001720db;
                if (0x21 < pMVar10[uVar50]) {
                  if (iStack_2d4 == 0) {
                    bVar57 = -1 < (int)uStack_2fc;
                    uVar36 = uStack_2bc;
                    uVar24 = uStack_2bc;
                    uStack_2fc = (uint)sVar56;
                    if (bVar57) {
                      __assert_fail("in_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5f,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  else {
                    uVar36 = uStack_2fc;
                    uVar24 = (uint)sVar56;
                    if (-1 < (int)uStack_2bc) {
                      __assert_fail("out_mem_op_num < 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1f5b,
                                    "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                   );
                    }
                  }
                  uStack_2bc = uVar24;
                  if ((((int)uVar36 < 0) ||
                      (uVar43 != *(uint *)&pDStack_2c8[(ulong)uVar36 * 3 + 2].prev)) ||
                     (uVar50 != *(uint *)((long)&pDStack_2c8[(ulong)uVar36 * 3 + 2].prev + 4))) {
                    uStack_2b0 = (ulong)((int)uStack_2b0 + 2);
                  }
                }
              }
            }
          }
          if (pgStack_2d0 != (gen_ctx *)0x0) {
            if (uVar43 != 0xffffffff) {
              update_live(uVar43,0,(bitmap_t)*(bb_t *)&pgStack_2d0->optimize_level);
              uVar54 = (ulong)puVar53[-1];
              if (0x21 < uVar54) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_2d0->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d6;
                if ((uVar54 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar43 = puVar53[-1] >> 6,
                   pbVar12 = (&peVar30->src)[uVar43],
                   (&peVar30->src)[uVar43] = (bb_t)((ulong)pbVar12 & ~(1L << (uVar54 & 0x3f))),
                   ((ulong)pbVar12 >> (uVar54 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,puVar53[-1],base_reg,(MIR_insn_t)pgVar46,1,0);
                }
              }
            }
            pgVar37 = pgStack_2d0;
            ctx = pMStack_2b8;
            if (*puVar53 != 0xffffffff) {
              update_live(*puVar53,0,(bitmap_t)*(bb_t *)&pgStack_2d0->optimize_level);
              ctx = pMStack_2b8;
              uVar54 = (ulong)*puVar53;
              if (0x21 < uVar54) {
                peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar37->curr_func_item)->prev;
                if (peVar30 == (in_edge_t)0x0) goto LAB_001720d1;
                if ((uVar54 < (ulong)((long)peVar30->src << 6)) &&
                   (peVar30 = (peVar30->in_link).prev, uVar43 = *puVar53 >> 6,
                   pbVar12 = (&peVar30->src)[uVar43],
                   (&peVar30->src)[uVar43] = (bb_t)((ulong)pbVar12 & ~(1L << (uVar54 & 0x3f))),
                   ((ulong)pbVar12 >> (uVar54 & 0x3f) & 1) != 0)) {
                  spill_restore_reg(pgVar45,*puVar53,base_reg,(MIR_insn_t)pgVar46,1,0);
                }
              }
            }
          }
        }
        else if ((char)puVar53[-7] == '\x02') {
          uVar54 = (ulong)puVar53[-5];
          if (uVar54 < 0x22) {
            pVVar9 = pgVar45->func_used_hard_regs;
            bitmap_expand(pVVar9,uVar54 + 1);
            if (pVVar9 == (bitmap_t)0x0) goto LAB_001720b8;
            *pVVar9->varr = *pVVar9->varr | 1L << (uVar54 & 0x3f);
            if (pgStack_2d0 != (gen_ctx *)0x0) {
              update_live(puVar53[-5],iStack_2d4,(bitmap_t)*(bb_t *)&pgStack_2d0->optimize_level);
            }
          }
          else {
            if (iStack_2d4 == 0) {
              pVVar14 = pgVar45->ra_ctx->reg_renumber;
              if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
                 (pVVar14->els_num <= uVar54)) goto LAB_001720b3;
              if (0x21 < pVVar14->varr[uVar54]) {
                uStack_2b0 = (ulong)((int)uStack_2b0 + (uint)(MVar27 - MIR_OP_REF < 0xfffffffd));
              }
            }
            ctx = pMStack_2b8;
            if (pgStack_2d0 != (gen_ctx *)0x0) {
              update_live(puVar53[-5],iStack_2d4,(bitmap_t)*(bb_t *)&pgStack_2d0->optimize_level);
              ctx = pMStack_2b8;
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgVar37->curr_func_item)->prev;
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720cc;
              uVar54 = (ulong)puVar53[-5];
              if ((uVar54 < (ulong)((long)peVar30->src << 6)) &&
                 (peVar30 = (peVar30->in_link).prev, uVar43 = puVar53[-5] >> 6,
                 pbVar12 = (&peVar30->src)[uVar43],
                 (&peVar30->src)[uVar43] = (bb_t)((ulong)pbVar12 & ~(1L << (uVar54 & 0x3f))),
                 ((ulong)pbVar12 >> (uVar54 & 0x3f) & 1) != 0)) {
                spill_restore_reg(pgVar45,puVar53[-5],base_reg,(MIR_insn_t)pgVar46,1,0);
              }
            }
          }
        }
      }
      sVar56 = sVar56 + 1;
      puVar53 = puVar53 + 0xc;
    } while (sStack_2a8 != sVar56);
  }
  pgVar37 = pgStack_2d0;
  if (iVar26 != 0 || pgStack_2d0 == (gen_ctx *)0x0) goto LAB_00171238;
  target_get_early_clobbered_hard_regs
            ((MIR_insn_t)pgVar46,(MIR_reg_t *)&MStack_230,(MIR_reg_t *)&MStack_260);
  if ((MIR_reg_t)MStack_230.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_230.data,1,(bitmap_t)*(bb_t *)&pgVar37->optimize_level);
  }
  if ((MIR_reg_t)MStack_260.data != 0xffffffff) {
    update_live((MIR_reg_t)MStack_260.data,1,(bitmap_t)*(bb_t *)&pgVar37->optimize_level);
  }
  if (*(int *)&pgVar46->debug_file - 0xaaU < 0xfffffffd) goto LAB_00171238;
  pVVar9 = pgVar45->call_used_hard_regs[0x12];
  if (pVVar9 != (bitmap_t)0x0) {
    pMVar38 = pgVar46->ctx;
    uVar54 = 0;
    do {
      pgVar37 = pgStack_2d0;
      uVar39 = uVar54 >> 6;
      uVar31 = pVVar9->els_num;
      bVar57 = true;
      uVar47 = uVar54;
      if (uVar39 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00170f18:
        if ((pVVar9->varr[uVar39] == 0) ||
           (uVar49 = pVVar9->varr[uVar39] >> (uVar54 & 0x3f), uVar49 == 0)) goto LAB_00170f2b;
        uVar31 = uVar49 & 1;
        uStack_2e0 = uVar54;
        while (uVar31 == 0) {
          uStack_2e0 = uStack_2e0 + 1;
          uVar31 = uVar49 & 2;
          uVar49 = uVar49 >> 1;
        }
        uVar47 = uStack_2e0 + 1;
        bVar57 = false;
      }
LAB_00170f64:
      if (bVar57) goto LAB_00170f94;
      update_live((MIR_reg_t)uStack_2e0,1,(bitmap_t)*(bb_t *)&pgStack_2d0->optimize_level);
      uVar54 = uVar47;
      if (pVVar9 == (bitmap_t)0x0) break;
    } while( true );
  }
  rewrite_insn_cold_16();
  goto LAB_0017209a;
LAB_00170530:
  pgStack_68 = (gen_ctx *)0x170535;
  gap_lr_spill_cost_cold_3();
  goto LAB_00170535;
LAB_00170f2b:
  uVar39 = uVar39 + 1;
  uVar54 = uVar39 * 0x40;
  if (uVar31 == uVar39) goto LAB_00170f64;
  goto LAB_00170f18;
LAB_00170f94:
  pHVar11 = pMVar38->module_item_tab;
  if (pHVar11 != (HTAB_MIR_item_t *)0x0) {
    uVar54 = 0;
    do {
      uVar39 = uVar54 >> 6;
      uVar31._0_4_ = pHVar11->els_num;
      uVar31._4_4_ = pHVar11->els_start;
      bVar57 = true;
      uVar47 = uVar54;
      if (uVar39 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00170fc9:
        uVar49 = *(ulong *)((long)pHVar11->arg + uVar39 * 8);
        if ((uVar49 == 0) || (uVar49 = uVar49 >> (uVar54 & 0x3f), uVar49 == 0)) goto LAB_00170fdc;
        uVar31 = uVar49 & 1;
        uStack_2e0 = uVar54;
        while (uVar31 == 0) {
          uStack_2e0 = uStack_2e0 + 1;
          uVar31 = uVar49 & 2;
          uVar49 = uVar49 >> 1;
        }
        uVar47 = uStack_2e0 + 1;
        bVar57 = false;
      }
LAB_00171015:
      if (bVar57) goto LAB_0017103a;
      update_live((MIR_reg_t)uStack_2e0,0,(bitmap_t)*(bb_t *)&pgVar37->optimize_level);
      uVar54 = uVar47;
      if (pHVar11 == (HTAB_MIR_item_t *)0x0) break;
    } while( true );
  }
LAB_0017209a:
  rewrite_insn_cold_15();
LAB_0017209f:
  rewrite_insn_cold_14();
LAB_001720a4:
  rewrite_insn_cold_12();
LAB_001720a9:
  rewrite_insn_cold_13();
LAB_001720ae:
  rewrite_insn_cold_2();
LAB_001720b3:
  rewrite_insn_cold_8();
LAB_001720b8:
  rewrite_insn_cold_9();
LAB_001720bd:
  rewrite_insn_cold_6();
LAB_001720c2:
  rewrite_insn_cold_5();
LAB_001720c7:
  rewrite_insn_cold_11();
LAB_001720cc:
  rewrite_insn_cold_7();
LAB_001720d1:
  rewrite_insn_cold_4();
LAB_001720d6:
  rewrite_insn_cold_3();
LAB_001720db:
  rewrite_insn_cold_1();
LAB_001720e0:
  rewrite_insn_cold_10();
  goto LAB_001720e5;
LAB_00170fdc:
  uVar39 = uVar39 + 1;
  uVar54 = uVar39 * 0x40;
  if (uVar31 == uVar39) goto LAB_00171015;
  goto LAB_00170fc9;
LAB_0017103a:
  pbVar12 = *(bb_t *)&pgVar37->optimize_level;
  if (pbVar12 != (bb_t)0x0) {
    uVar54 = 0;
    do {
      uVar39 = uVar54 >> 6;
      uVar31 = pbVar12->index;
      bVar57 = true;
      uVar47 = uVar54;
      if (uVar39 < uVar31) {
        uVar47 = uVar31 << 6;
LAB_00171068:
        uVar49 = *(ulong *)(pbVar12->rpost + uVar39 * 8);
        if ((uVar49 == 0) || (uVar49 = uVar49 >> (uVar54 & 0x3f), uVar49 == 0)) goto LAB_0017107b;
        uVar31 = uVar49 & 1;
        uStack_2e0 = uVar54;
        while (uVar31 == 0) {
          uStack_2e0 = uStack_2e0 + 1;
          uVar31 = uVar49 & 2;
          uVar49 = uVar49 >> 1;
        }
        uVar47 = uStack_2e0 + 1;
        bVar57 = false;
      }
LAB_001710b4:
      if (bVar57) goto LAB_00171238;
      if (0x21 < uStack_2e0) {
        pMVar13 = (pgStack_2d0->ctx->environment_module).module_link.next;
        if (pMVar13 == (MIR_module_t)0x0) goto LAB_001720a9;
        uVar54 = uStack_2e0 & 0xffffffff;
        if (((ulong)((long)pMVar13->data << 6) <= uVar54) ||
           (((ulong)(&((pMVar13->items).head)->data)[(uint)uStack_2e0 >> 6] >> (uStack_2e0 & 0x3f) &
            1) == 0)) {
          pVVar14 = pgVar45->ra_ctx->reg_renumber;
          if ((pVVar14 == (VARR_MIR_reg_t *)0x0) ||
             ((pVVar14->varr == (MIR_reg_t *)0x0 || (pVVar14->els_num <= uVar54))))
          goto LAB_001720a4;
          uVar31 = (ulong)pVVar14->varr[uVar54];
          if (uVar31 < 0x22) {
            MIR_reg_type(pgVar45->ctx,(uint)uStack_2e0 - 0x21,(pgVar45->curr_func_item->u).func);
            ctx = pMStack_2b8;
            pVVar9 = pgVar45->call_used_hard_regs[0x12];
            if (pVVar9 == (bitmap_t)0x0) goto LAB_001720c7;
            if ((uVar31 < pVVar9->els_num << 6) && ((*pVVar9->varr >> (uVar31 & 0x3f) & 1) != 0)) {
              peVar30 = ((DLIST_LINK_in_edge_t *)&pgStack_2d0->curr_func_item)->prev;
              bitmap_expand((bitmap_t)peVar30,uVar54 + 1);
              if (peVar30 == (in_edge_t)0x0) goto LAB_001720e0;
              peVar30 = (peVar30->in_link).prev;
              pbVar15 = (&peVar30->src)[(uint)uStack_2e0 >> 6];
              (&peVar30->src)[(uint)uStack_2e0 >> 6] =
                   (bb_t)((ulong)pbVar15 | 1L << (uStack_2e0 & 0x3f));
              if (((ulong)pbVar15 >> (uStack_2e0 & 0x3f) & 1) == 0) {
                spill_restore_reg(pgVar45,(uint)uStack_2e0,base_reg,(MIR_insn_t)pgVar46,1,1);
              }
            }
          }
        }
      }
      uVar54 = uVar47;
      if (pbVar12 == (bb_t)0x0) break;
    } while( true );
  }
  goto LAB_0017209f;
LAB_0017107b:
  uVar39 = uVar39 + 1;
  uVar54 = uVar39 * 0x40;
  if (uVar31 == uVar39) goto LAB_001710b4;
  goto LAB_00171068;
LAB_00171238:
  bVar57 = iVar26 != 0;
  iVar26 = iVar26 + 1;
  if (bVar57) goto code_r0x00171245;
  goto LAB_00170986;
code_r0x00171245:
  prVar16 = pgVar45->ra_ctx;
  prVar16->in_reloads_num = 0;
  prVar16->out_reloads_num = 0;
  if ((int)uStack_2b0 < 3) {
LAB_0017165a:
    bVar57 = *(int *)&pgVar46->debug_file - 0x22U < 0xfffffffc;
    if (!bVar57) {
      if (bVar57) {
        __assert_fail("MIR_addr_code_p (insn->code)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f03,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      if (*(char *)&pgVar46->temp_bitmap2 != '\x02') {
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar43 = *(uint *)&pgVar46->temp_bitmap3;
      if (0xffffffdc < uVar43 - 0x22) {
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar14 = pgVar45->ra_ctx->reg_renumber;
      if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
         (pVVar14->els_num <= (ulong)uVar43)) goto LAB_00172195;
      pMVar38 = pgVar45->ctx;
      uVar50 = pVVar14->varr[uVar43];
      MVar28 = MIR_reg_type(pMVar38,uVar43 - 0x21,(pgVar45->curr_func_item->u).func);
      if (uVar50 < 0x22) {
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar50 = uVar50 - 0x22;
      if (pgVar45->target_ctx->keep_fp_p == '\0') {
        lVar42 = (ulong)uVar50 << 3;
      }
      else {
        lVar42 = -0xb0;
        if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
          lVar42 = 0;
        }
        lVar42 = lVar42 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar50) * -8;
      }
      MVar29 = get_reload_hreg(pgVar45,0xffffffff,6,0);
      _MIR_new_var_op(pMVar38,MVar29);
      iVar33 = _MIR_addr_offset(pMVar38,*(MIR_insn_code_t *)&pgVar46->debug_file);
      MIR_new_int_op(pMVar38,lVar42 + iVar33);
      pMVar32 = MIR_new_insn(pMVar38,MIR_MOV);
      _MIR_new_var_op(pMVar38,MVar29);
      _MIR_new_var_op(pMVar38,MVar29);
      _MIR_new_var_op(pMVar38,base_reg);
      insn = MIR_new_insn(pMVar38,MIR_ADD);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        if (pgVar45->optimize_level == 0) {
          uVar43 = *(int *)&pgVar46->debug_file - 0xa7;
          pgVar34 = pgVar46;
          if ((uVar43 < 0xe) && ((0x2007U >> (uVar43 & 0x1f) & 1) != 0)) {
            pgVar34 = (gen_ctx_t)pgVar46->ctx;
          }
        }
        else {
          pgVar34 = (gen_ctx_t)&pgVar46->ctx->temp_string;
        }
        fprintf((FILE *)pgVar45->debug_file,"    Adding before insn (in BB %lu) ",
                pgVar34->ctx->gen_ctx);
        MIR_output_insn(pMVar38,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(":\n      ",8,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar38,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar38,pgVar45->debug_file,insn,(pgVar45->curr_func_item->u).func,1);
      }
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,insn);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Changing ",9,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar38,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
      }
      *(undefined4 *)&pgVar46->debug_file = 0;
      _MIR_new_var_op(pMVar38,MVar29);
      auVar3._16_16_ = auStack_160;
      auVar3._0_16_ = auStack_170;
      pgVar46->temp_bitmap3 = (bitmap_t)auStack_160._0_8_;
      pgVar46->call_used_hard_regs[0] = (bitmap_t)auStack_160._8_8_;
      pgVar46->call_used_hard_regs[1] = (bitmap_t)auStack_150._0_8_;
      pgVar46->call_used_hard_regs[2] = (bitmap_t)auStack_150._8_8_;
      *(undefined1 (*) [32])&pgVar46->temp_bitmap = auVar3;
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite(" to ",4,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar38,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,1);
      }
    }
    if (sStack_2a8 != 0) {
      uVar43 = *(int *)&pgVar46->debug_file - 0xaa;
      sVar56 = 0;
      pgStack_2d0 = (gen_ctx *)CONCAT44(pgStack_2d0._4_4_,uVar43);
      do {
        pDVar52 = pDStack_2c8 + sVar56 * 3;
        MVar27 = MIR_insn_op_mode(pMStack_2b8,(MIR_insn_t_conflict)pgVar46,sVar56,&iStack_2d4);
        if ((pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          pauVar35 = (undefined1 (*) [32])&pbStack_200;
          if (iStack_2d4 == 0) {
            pauVar35 = (undefined1 (*) [32])&pbStack_1d0;
          }
          auVar3 = *(undefined1 (*) [32])pDVar52;
          *(undefined1 (*) [32])(*pauVar35 + 0x10) = *(undefined1 (*) [32])(pDVar52 + 1);
          *pauVar35 = auVar3;
        }
        if (*(char *)&pDVar52->next == '\v') {
          if ((uVar43 < 0xfffffffd) ||
             (*(byte *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head - 0x11 < 0xfffffffb)) {
            if (0x22 < *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar52 + 2))->head + 1) {
              MVar29 = change_reg(pgVar45,&MStack_2a0,
                                  *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar52 + 2))->head,base_reg,
                                  MIR_OP_INT,(MIR_insn_t)pgVar46,0);
              *(MIR_reg_t *)&((DLIST_out_edge_t *)(pDVar52 + 2))->head = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar29 = *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar52 + 2))->head + 4);
            if (0x22 < MVar29 + 1) {
              MVar29 = change_reg(pgVar45,&MStack_2a0,MVar29,base_reg,MIR_OP_INT,(MIR_insn_t)pgVar46
                                  ,0);
              *(MIR_reg_t *)((long)&((DLIST_out_edge_t *)(pDVar52 + 2))->head + 4) = MVar29;
              if (MVar29 == 0xffffffff) {
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((*(char *)&pDVar52->next == '\x02') &&
                (0x21 < *(uint *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head)) {
          if (MVar27 == MIR_OP_VAR) {
            if ((*(int *)&pgVar46->debug_file != 0xb9) &&
               ((sVar56 != 1 || (3 < *(int *)&pgVar46->debug_file - 0x1eU)))) goto LAB_0017219a;
            MVar28 = MIR_reg_type(pMStack_2b8,
                                  *(uint *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head - 0x21,
                                  (pgVar45->curr_func_item->u).func);
            if (MVar28 == MIR_T_F) {
              MVar27 = MIR_OP_FLOAT;
            }
            else if (MVar28 == MIR_T_D) {
              MVar27 = MIR_OP_DOUBLE;
            }
            else {
              MVar27 = (uint)(MVar28 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar14 = pgVar45->ra_ctx->reg_renumber;
          if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
             (pVVar14->els_num <= (ulong)*(uint *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head)) {
LAB_001720e5:
            rewrite_insn_cold_18();
LAB_001720ed:
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar56 == 0) && (*(int *)&pgVar46->debug_file - 0x22U < 0xfffffffc)) &&
             (uVar50 = pVVar14->varr[*(uint *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head],
             0x21 < uVar50)) {
            pMVar38 = pgVar45->ctx;
            MVar28 = MIR_reg_type(pMVar38,*(int *)&((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head
                                          - 0x21,(pgVar45->curr_func_item->u).func);
            uVar50 = uVar50 - 0x22;
            if (pgVar45->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar50 << 3;
            }
            else {
              lVar42 = -0xb0;
              if (((pgVar45->curr_func_item->u).func)->vararg_p == '\0') {
                lVar42 = 0;
              }
              disp = lVar42 + (ulong)((MVar28 == MIR_T_LD) + 1 + uVar50) * -8;
            }
            iVar26 = *(int *)&((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head;
            auVar3 = *(undefined1 (*) [32])pDStack_2c8;
            MStack_230.u._16_8_ = SUB328(*(undefined1 (*) [32])(pDStack_2c8 + 1),0x10);
            MStack_230.u.mem.disp = SUB328(*(undefined1 (*) [32])(pDStack_2c8 + 1),0x18);
            MStack_230.data._0_4_ = auVar3._0_4_;
            MStack_230.data._4_4_ = auVar3._4_4_;
            MStack_230._8_8_ = auVar3._8_8_;
            MStack_230.u.i = auVar3._16_8_;
            MStack_230.u.str.s = auVar3._24_8_;
            _MIR_new_var_mem_op(&MStack_260,pMVar38,MVar28,disp,base_reg,0xffffffff,'\0');
            pFVar17 = pgVar46->debug_file;
            if ((int)((ulong)pFVar17 >> 0x20) < 1) {
              uVar43 = 0;
            }
            else {
              uVar54 = 0;
              uVar43 = 0;
              pDVar40 = (DLIST_in_edge_t *)&pgVar46->addr_insn_p;
              do {
                if ((*(char *)&((DLIST_LINK_bb_t *)(pDVar40 + -1))->next == '\x02') &&
                   (*(int *)&pDVar40->head == iVar26)) {
                  auVar20._4_4_ = MStack_260.data._4_4_;
                  auVar20._0_4_ = (MIR_reg_t)MStack_260.data;
                  auVar20._8_8_ = MStack_260._8_8_;
                  auVar20._16_8_ = MStack_260.u.i;
                  auVar20._24_8_ = MStack_260.u.str.s;
                  auVar21._8_8_ = MStack_260.u.str.s;
                  auVar21._0_8_ = MStack_260.u.i;
                  auVar21._16_8_ = MStack_260.u._16_8_;
                  auVar21._24_8_ = MStack_260.u.mem.disp;
                  *(undefined1 (*) [32])pDVar40 = auVar21;
                  *(undefined1 (*) [32])(pDVar40 + -1) = auVar20;
                  if (1 < (int)uVar43) goto LAB_001720ed;
                  lVar42 = (long)(int)uVar43;
                  uVar43 = uVar43 + 1;
                  aiStack_1a0[lVar42] = (int)uVar54;
                }
                uVar54 = uVar54 + 1;
                pDVar40 = pDVar40 + 3;
              } while ((ulong)pFVar17 >> 0x20 != uVar54);
            }
            iVar26 = find_insn_pattern(pgVar45,(MIR_insn_t)pgVar46,(int *)0x0);
            if (0 < (int)uVar43 && iVar26 < 0) {
              uVar54 = 0;
              do {
                iVar25 = aiStack_1a0[uVar54];
                auVar22._4_4_ = MStack_230.data._4_4_;
                auVar22._0_4_ = (MIR_reg_t)MStack_230.data;
                auVar22._8_8_ = MStack_230._8_8_;
                auVar22._16_8_ = MStack_230.u.i;
                auVar22._24_8_ = MStack_230.u.str.s;
                auVar23._8_8_ = MStack_230.u.str.s;
                auVar23._0_8_ = MStack_230.u.i;
                auVar23._16_8_ = MStack_230.u._16_8_;
                auVar23._24_8_ = MStack_230.u.mem.disp;
                *(undefined1 (*) [32])(pDStack_2c8 + (long)iVar25 * 3 + 1) = auVar23;
                *(undefined1 (*) [32])(pDStack_2c8 + (long)iVar25 * 3) = auVar22;
                uVar54 = uVar54 + 1;
              } while (uVar43 != uVar54);
            }
            uVar43 = (uint)pgStack_2d0;
            if (-1 < iVar26) goto LAB_00171ebc;
          }
          MVar29 = change_reg(pgVar45,&MStack_2a0,
                              *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head,base_reg,
                              MVar27,(MIR_insn_t)pgVar46,iStack_2d4);
          if (MVar29 == 0xffffffff) {
            auVar18._8_8_ = MStack_2a0._8_8_;
            auVar18._0_8_ = MStack_2a0.data;
            auVar18._16_8_ = MStack_2a0.u.i;
            auVar18._24_8_ = MStack_2a0.u.str.s;
            auVar19._8_8_ = MStack_2a0.u.str.s;
            auVar19._0_8_ = MStack_2a0.u.i;
            auVar19._16_8_ = MStack_2a0.u._16_8_;
            auVar19._24_8_ = MStack_2a0.u.mem.disp;
            *(undefined1 (*) [32])(pDVar52 + 1) = auVar19;
            *(undefined1 (*) [32])pDVar52 = auVar18;
          }
          else {
            *(MIR_reg_t *)&((DLIST_in_edge_t *)(pDVar52 + 1))->head = MVar29;
          }
        }
LAB_00171ebc:
        sVar56 = sVar56 + 1;
      } while (sVar56 != sStack_2a8);
    }
    pDVar52 = pDStack_2c8;
    iVar26 = 0;
    if ((((ulong)pgVar46->debug_file & 0xfffffffc) == 0) &&
       (op1_00._12_4_ = (int)((ulong)pgVar46->to_free >> 0x20),
       op1_00._0_12_ = *(undefined1 (*) [12])&pgVar46->debug_level,
       op1_00.u.i = (int64_t)((DLIST_in_edge_t *)&pgVar46->addr_insn_p)->head,
       op1_00.u.mem.nonalias = (int)(in_edge_t_conflict)pgVar46->tied_regs,
       op1_00.u.mem.nloc = (int)((ulong)pgVar46->tied_regs >> 0x20),
       op1_00.u._16_8_ = ((DLIST_out_edge_t *)&pgVar46->addr_regs)->head,
       op1_00.u.mem.disp = (MIR_disp_t)pgVar46->insn_to_consider,
       iVar25 = MIR_op_eq_p(pMStack_2b8,op1_00,*(MIR_op_t *)&pgVar46->temp_bitmap), iVar26 = 0,
       iVar25 != 0)) {
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("Deleting noop move ",0x13,1,(FILE *)pgVar45->debug_file);
        pMVar38 = pMStack_2b8;
        MIR_output_insn(pMStack_2b8,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,0);
        fwrite(" which was ",0xb,1,(FILE *)pgVar45->debug_file);
        ((DLIST_in_edge_t *)(pDVar52 + 1))->head = peStack_1f0;
        ((DLIST_in_edge_t *)(pDVar52 + 1))->tail = peStack_1e8;
        ((DLIST_out_edge_t *)(pDVar52 + 2))->head = peStack_1e0;
        ((DLIST_out_edge_t *)(pDVar52 + 2))->tail = peStack_1d8;
        pDVar52->prev = pbStack_200;
        pDVar52->next = pbStack_1f8;
        ((DLIST_in_edge_t *)(pDVar52 + 1))->head = peStack_1f0;
        ((DLIST_in_edge_t *)(pDVar52 + 1))->tail = peStack_1e8;
        pgVar46->temp_bitmap3 = pVStack_1c0;
        pgVar46->call_used_hard_regs[0] = pVStack_1b8;
        pgVar46->call_used_hard_regs[1] = pVStack_1b0;
        pgVar46->call_used_hard_regs[2] = pVStack_1a8;
        ((DLIST_bb_insn_t *)&pgVar46->temp_bitmap)->head = pbStack_1d0;
        pgVar46->temp_bitmap2 = (bitmap_t)pbStack_1c8;
        pgVar46->temp_bitmap3 = pVStack_1c0;
        pgVar46->call_used_hard_regs[0] = pVStack_1b8;
        MIR_output_insn(pMVar38,pgVar45->debug_file,(MIR_insn_t_conflict)pgVar46,
                        (pgVar45->curr_func_item->u).func,1);
      }
      if ((((pgVar45->optimize_level != 0) &&
           (pMVar38 = pgVar46->ctx, pMVar38 != (MIR_context_t)0x0)) &&
          ((MIR_context_t)pMVar38->temp_string[3].size == pMVar38)) &&
         ((MIR_context_t)pMVar38->temp_string[3].varr == pMVar38)) {
        pMVar32 = MIR_new_insn_arr(pgVar45->ctx,MIR_USE,0,(MIR_op_t *)0x0);
        MIR_insert_insn_before
                  (pgVar45->ctx,pgVar45->curr_func_item,(MIR_insn_t_conflict)pMVar38->gen_ctx,
                   pMVar32);
        add_new_bb_insn(pgVar45,pMVar32,(bb_t_conflict)pMVar38->temp_string,0);
      }
      gen_delete_insn(pgVar45,(MIR_insn_t)pgVar46);
      iVar26 = 1;
    }
    return iVar26;
  }
  if ((int)(uStack_2fc & uStack_2bc) < 0) {
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar38 = pgVar45->ctx;
  uVar43 = uStack_2fc;
  if (-1 < (int)uStack_2bc) {
    uVar43 = uStack_2bc;
  }
  lVar42 = (long)(int)uVar43;
  uVar43 = *(uint *)&pDStack_2c8[lVar42 * 3 + 2].prev;
  uVar47 = (ulong)*(uint *)((long)&pDStack_2c8[lVar42 * 3 + 2].prev + 4);
  uVar54 = (ulong)uStack_2fc;
  uVar31 = (ulong)uStack_2bc;
  if (-1 < (int)(uStack_2fc | uStack_2bc)) {
    pDVar52 = pDStack_2c8 + uVar54 * 3;
    op1._12_4_ = (int)((ulong)pDVar52->next >> 0x20);
    op1._0_12_ = *(undefined1 (*) [12])pDVar52;
    op1.u.i = (int64_t)((DLIST_in_edge_t *)(pDVar52 + 1))->head;
    op1.u.mem.nonalias = (int)((DLIST_in_edge_t *)(pDVar52 + 1))->tail;
    op1.u.mem.nloc = (int)((ulong)((DLIST_in_edge_t *)(pDVar52 + 1))->tail >> 0x20);
    op1.u._16_8_ = pDStack_2c8[uVar54 * 3 + 2].prev;
    op1.u.mem.disp = (MIR_disp_t)pDStack_2c8[uVar54 * 3 + 2].next;
    op2.u._16_8_ = pDStack_2c8[uVar31 * 3 + 2].prev;
    op2._0_32_ = *(undefined1 (*) [32])(pDStack_2c8 + uVar31 * 3);
    op2.u.mem.disp = (MIR_disp_t)pDStack_2c8[uVar31 * 3 + 2].next;
    iVar26 = MIR_op_eq_p(pMVar38,op1,op2);
    if (iVar26 == 0) {
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
  }
  pVVar14 = pgVar45->ra_ctx->reg_renumber;
  if (((pVVar14 == (VARR_MIR_reg_t *)0x0) || (pVVar14->varr == (MIR_reg_t *)0x0)) ||
     (pVVar14->els_num <= (ulong)uVar43)) {
    rewrite_insn_cold_20();
  }
  else {
    add_ld_st(pgVar45,&MStack_230,pVVar14->varr[uVar43],base_reg,MIR_OP_INT,10,0,10,
              (MIR_insn_t)pgVar46,0);
    pDVar52 = pDStack_2c8;
    pVVar14 = pgVar45->ra_ctx->reg_renumber;
    if (((pVVar14 != (VARR_MIR_reg_t *)0x0) && (pVVar14->varr != (MIR_reg_t *)0x0)) &&
       (uVar47 < pVVar14->els_num)) {
      add_ld_st(pgVar45,&MStack_230,pVVar14->varr[uVar47],base_reg,MIR_OP_INT,0xb,0,0xb,
                (MIR_insn_t)pgVar46,0);
      _MIR_new_var_op(pMVar38,10);
      _MIR_new_var_op(pMVar38,0xb);
      bVar4 = *(byte *)((long)&pDVar52[lVar42 * 3 + 1].prev + 1);
      uVar47 = (ulong)bVar4;
      if (bVar4 == 0) {
        iVar33 = -1;
LAB_00171476:
        MIR_new_int_op(pMVar38,iVar33);
        pMVar32 = MIR_new_insn(pMVar38,MIR_LSH);
        gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
        if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
          fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
          MIR_output_insn(pMVar38,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
        }
      }
      else if (bVar4 != 1) {
        lVar42 = 0;
        uVar39 = uVar47;
        if ((bVar4 & 1) == 0) {
          do {
            lVar42 = lVar42 + 1;
            uVar47 = uVar39 >> 1;
            uVar49 = uVar39 & 2;
            uVar39 = uVar47;
          } while (uVar49 == 0);
        }
        iVar33 = -1;
        if (uVar47 == 1) {
          iVar33 = lVar42;
        }
        goto LAB_00171476;
      }
      pMVar32 = MIR_new_insn(pMVar38,MIR_ADD);
      gen_add_insn_before(pgVar45,(MIR_insn_t)pgVar46,pMVar32);
      if (((FILE *)pgVar45->debug_file != (FILE *)0x0) && (1 < pgVar45->debug_level)) {
        fwrite("      ",6,1,(FILE *)pgVar45->debug_file);
        MIR_output_insn(pMVar38,pgVar45->debug_file,pMVar32,(pgVar45->curr_func_item->u).func,1);
      }
      if (-1 < (int)uStack_2bc) {
        pDStack_2c8[uVar31 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      if (-1 < (int)uStack_2fc) {
        pDStack_2c8[uVar54 * 3 + 2].prev = (bb_t)0xffffffff0000000a;
      }
      get_reload_hreg(pgVar45,0xffffffff,6,0);
      goto LAB_0017165a;
    }
  }
  rewrite_insn_cold_19();
LAB_00172195:
  rewrite_insn_cold_17();
LAB_0017219a:
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
}

Assistant:

static int available_hreg_p (int hreg, MIR_reg_t type, int nregs, bitmap_t *conflict_locs,
                             live_range_t lr) {
  for (int j = lr->start; j <= lr->finish; j++) {
    if (bitmap_bit_p (conflict_locs[j], hreg)) return FALSE;
    if (nregs > 1) {
      if (target_nth_loc (hreg, type, nregs - 1) > MAX_HARD_REG) return FALSE;
      for (int k = nregs - 1; k > 0; k--) {
        MIR_reg_t curr_hreg = target_nth_loc (hreg, type, k);
        if (bitmap_bit_p (conflict_locs[j], curr_hreg)) return FALSE;
      }
    }
  }
  return TRUE;
}